

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::ProcessDefaultAction(Element *this,Event *event)

{
  Vector2f VVar1;
  bool bVar2;
  EventId EVar3;
  uint uVar4;
  int iVar5;
  EventPhase EVar6;
  float x;
  float y;
  allocator<char> local_1e9;
  String local_1e8;
  allocator<char> local_1c1;
  String local_1c0;
  allocator<char> local_199;
  String local_198;
  bool local_172;
  allocator<char> local_171;
  String local_170;
  allocator<char> local_149;
  String local_148;
  allocator<char> local_121;
  String local_120;
  allocator<char> local_f9;
  String local_f8;
  allocator<char> local_d1;
  String local_d0;
  int local_b0;
  byte local_ab;
  byte local_aa;
  allocator<char> local_a9;
  String local_a8;
  Vector2<float> local_88;
  float local_80;
  allocator<char> local_79;
  String local_78;
  float local_58 [5];
  allocator<char> local_41;
  String local_40;
  Vector2<float> local_20;
  Vector2f mouse_pos;
  Event *event_local;
  Element *this_local;
  
  mouse_pos = (Vector2f)event;
  bVar2 = Event::operator==(event,Mousedown);
  VVar1 = mouse_pos;
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"mouse_x",&local_41);
    local_58[0] = 0.0;
    x = Event::GetParameter<float>((Event *)VVar1,&local_40,local_58);
    VVar1 = mouse_pos;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"mouse_y",&local_79);
    local_80 = 0.0;
    y = Event::GetParameter<float>((Event *)VVar1,&local_78,&local_80);
    Vector2<float>::Vector2(&local_20,x,y);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::allocator<char>::~allocator(&local_79);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::allocator<char>::~allocator(&local_41);
    local_88 = local_20;
    uVar4 = (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[7])(local_20);
    VVar1 = mouse_pos;
    local_aa = 0;
    local_ab = 0;
    bVar2 = false;
    if ((uVar4 & 1) != 0) {
      ::std::allocator<char>::allocator();
      local_aa = 1;
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"button",&local_a9);
      local_ab = 1;
      local_b0 = 0;
      iVar5 = Event::GetParameter<int>((Event *)VVar1,&local_a8,&local_b0);
      bVar2 = iVar5 == 0;
    }
    if ((local_ab & 1) != 0) {
      ::std::__cxx11::string::~string((string *)&local_a8);
    }
    if ((local_aa & 1) != 0) {
      ::std::allocator<char>::~allocator(&local_a9);
    }
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"active",&local_d1);
      SetPseudoClass(this,&local_d0,true);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::allocator<char>::~allocator(&local_d1);
    }
  }
  EVar6 = Event::GetPhase((Event *)mouse_pos);
  if (EVar6 == Target) {
    EVar3 = Event::GetId((Event *)mouse_pos);
    switch(EVar3) {
    case Mouseover:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"hover",&local_f9);
      SetPseudoClass(this,&local_f8,true);
      ::std::__cxx11::string::~string((string *)&local_f8);
      ::std::allocator<char>::~allocator(&local_f9);
      break;
    case Mouseout:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"hover",&local_121);
      SetPseudoClass(this,&local_120,false);
      ::std::__cxx11::string::~string((string *)&local_120);
      ::std::allocator<char>::~allocator(&local_121);
      break;
    case Focus:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"focus",&local_149);
      SetPseudoClass(this,&local_148,true);
      ::std::__cxx11::string::~string((string *)&local_148);
      ::std::allocator<char>::~allocator(&local_149);
      VVar1 = mouse_pos;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"focus_visible",&local_171);
      local_172 = false;
      bVar2 = Event::GetParameter<bool>((Event *)VVar1,&local_170,&local_172);
      ::std::__cxx11::string::~string((string *)&local_170);
      ::std::allocator<char>::~allocator(&local_171);
      if (bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_198,"focus-visible",&local_199);
        SetPseudoClass(this,&local_198,true);
        ::std::__cxx11::string::~string((string *)&local_198);
        ::std::allocator<char>::~allocator(&local_199);
      }
      break;
    case Blur:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"focus",&local_1c1);
      SetPseudoClass(this,&local_1c0,false);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ::std::allocator<char>::~allocator(&local_1c1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"focus-visible",&local_1e9);
      SetPseudoClass(this,&local_1e8,false);
      ::std::__cxx11::string::~string((string *)&local_1e8);
      ::std::allocator<char>::~allocator(&local_1e9);
    }
  }
  return;
}

Assistant:

void Element::ProcessDefaultAction(Event& event)
{
	if (event == EventId::Mousedown)
	{
		const Vector2f mouse_pos(event.GetParameter("mouse_x", 0.f), event.GetParameter("mouse_y", 0.f));

		if (IsPointWithinElement(mouse_pos) && event.GetParameter("button", 0) == 0)
			SetPseudoClass("active", true);
	}

	if (event.GetPhase() == EventPhase::Target)
	{
		switch (event.GetId())
		{
		case EventId::Mouseover: SetPseudoClass("hover", true); break;
		case EventId::Mouseout: SetPseudoClass("hover", false); break;
		case EventId::Focus:
			SetPseudoClass("focus", true);
			if (event.GetParameter("focus_visible", false))
				SetPseudoClass("focus-visible", true);
			break;
		case EventId::Blur:
			SetPseudoClass("focus", false);
			SetPseudoClass("focus-visible", false);
			break;
		default: break;
		}
	}
}